

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelativeOffset.cpp
# Opt level: O3

ValueNumber __thiscall ValueRelativeOffset::BaseValueNumber(ValueRelativeOffset *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Value *pVVar4;
  
  pVVar4 = this->baseValue;
  if (pVVar4 == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueRelativeOffset.cpp"
                       ,0x2c,"(IsValid())","IsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pVVar4 = this->baseValue;
  }
  return pVVar4->valueNumber;
}

Assistant:

ValueNumber ValueRelativeOffset::BaseValueNumber() const
{
    Assert(IsValid());
    return baseValue->GetValueNumber();
}